

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void x86_stl_phys_x86_64(CPUState *cs,hwaddr addr,uint32_t val)

{
  AddressSpace *as;
  MemTxAttrs attrs;
  
  attrs = (MemTxAttrs)(*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x12 & 2);
  as = cpu_addressspace(cs,attrs);
  address_space_stl_x86_64((uc_struct_conflict *)as->uc,as,addr,val,attrs,(MemTxResult *)0x0);
  return;
}

Assistant:

void x86_stl_phys(CPUState *cs, hwaddr addr, uint32_t val)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    MemTxAttrs attrs = cpu_get_mem_attrs(env);
    AddressSpace *as = cpu_addressspace(cs, attrs);

#ifdef UNICORN_ARCH_POSTFIX
    glue(address_space_stl, UNICORN_ARCH_POSTFIX)(as->uc, as, addr, val, attrs, NULL);
#else
    address_space_stl(as->uc, as, addr, val, attrs, NULL);
#endif
}